

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall CList::insert(CList *this,AbstractSearchState *AbstractSearchState1,int listindex)

{
  int iVar1;
  listelement *plVar2;
  listelement *plVar3;
  SBPL_Exception *this_00;
  
  iVar1 = this->currentsize;
  if (iVar1 < 5000000) {
    if (AbstractSearchState1->listelem[listindex] == (listelement *)0x0) {
      plVar3 = (listelement *)malloc(0x18);
      plVar3->liststate = AbstractSearchState1;
      plVar3->prev = (listelement *)0x0;
      plVar2 = this->firstelement;
      plVar3->next = plVar2;
      if (plVar2 != (listelement *)0x0) {
        plVar2->prev = plVar3;
      }
      this->firstelement = plVar3;
      if (this->lastelement == (listelement *)0x0) {
        this->lastelement = plVar3;
      }
      AbstractSearchState1->listelem[listindex] = plVar3;
      this->currentsize = iVar1 + 1;
      return;
    }
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_00,"ERROR: insert: element is already in the list");
  }
  else {
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_00,"ERROR: list is full");
  }
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void insert(AbstractSearchState *AbstractSearchState1, int listindex)
    {
        if (currentsize >= LISTSIZE) {
            throw SBPL_Exception("ERROR: list is full");
        }
        if (AbstractSearchState1->listelem[listindex] != NULL) {
            throw SBPL_Exception("ERROR: insert: element is already in the list");
        }
        listelement *insertelem = (listelement*)malloc(sizeof(listelement));
        insertelem->liststate = AbstractSearchState1;
        insertelem->prev = NULL;
        insertelem->next = firstelement;
        if (firstelement != NULL) firstelement->prev = insertelem;
        firstelement = insertelem;
        if (lastelement == NULL) //if this is the first element to be inserted into the list
        lastelement = insertelem;
        AbstractSearchState1->listelem[listindex] = insertelem;
        currentsize++;
    }